

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float *pfVar1;
  float fVar2;
  long local_48;
  ImS64 scroll;
  float size_contents;
  float size_avail;
  ImDrawFlags rounding_corners;
  ImRect bb;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiAxis axis_local;
  
  unique0x00012000 = GImGui->CurrentWindow;
  bb.Max.x = (float)GetWindowScrollbarID(unique0x00012000,axis);
  KeepAliveID((ImGuiID)bb.Max.x);
  _size_avail = GetWindowScrollbarRect(stack0xffffffffffffffe0,axis);
  size_contents = 3.58732e-43;
  if (axis == ImGuiAxis_X) {
    size_contents = 4.48416e-43;
    if ((stack0xffffffffffffffe0->ScrollbarY & 1U) == 0) {
      size_contents = 6.27782e-43;
    }
  }
  else {
    if (((stack0xffffffffffffffe0->Flags & 1U) != 0) &&
       ((stack0xffffffffffffffe0->Flags & 0x400U) == 0)) {
      size_contents = 4.03574e-43;
    }
    if ((stack0xffffffffffffffe0->ScrollbarX & 1U) == 0) {
      size_contents = (float)((uint)size_contents | 0x80);
    }
  }
  pfVar1 = ImVec2::operator[](&(stack0xffffffffffffffe0->InnerRect).Max,(long)axis);
  fVar2 = *pfVar1;
  pfVar1 = ImVec2::operator[](&(stack0xffffffffffffffe0->InnerRect).Min,(long)axis);
  scroll._4_4_ = fVar2 - *pfVar1;
  pfVar1 = ImVec2::operator[](&stack0xffffffffffffffe0->ContentSize,(long)axis);
  fVar2 = *pfVar1;
  pfVar1 = ImVec2::operator[](&stack0xffffffffffffffe0->WindowPadding,(long)axis);
  scroll._0_4_ = *pfVar1 + *pfVar1 + fVar2;
  pfVar1 = ImVec2::operator[](&stack0xffffffffffffffe0->Scroll,(long)axis);
  local_48 = (long)*pfVar1;
  ScrollbarEx((ImRect *)&size_avail,(ImGuiID)bb.Max.x,axis,&local_48,(long)scroll._4_4_,
              (long)(float)scroll,(ImDrawFlags)size_contents);
  fVar2 = (float)local_48;
  pfVar1 = ImVec2::operator[](&stack0xffffffffffffffe0->Scroll,(long)axis);
  *pfVar1 = fVar2;
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawFlags rounding_corners = ImDrawFlags_RoundCornersNone;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawFlags_RoundCornersBottomLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawFlags_RoundCornersTopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ImS64 scroll = (ImS64)window->Scroll[axis];
    ScrollbarEx(bb, id, axis, &scroll, (ImS64)size_avail, (ImS64)size_contents, rounding_corners);
    window->Scroll[axis] = (float)scroll;
}